

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Signal_PDU.cpp
# Opt level: O1

void __thiscall KDIS::PDU::Signal_PDU::SetData(Signal_PDU *this,KOCTET *D,KUINT16 Length)

{
  vector<char,_std::allocator<char>_> *this_00;
  pointer *ppcVar1;
  KUINT16 *pKVar2;
  pointer pcVar3;
  iterator __position;
  bool bVar4;
  ulong in_RAX;
  ushort uVar5;
  ulong uVar6;
  uint uVar7;
  undefined8 uStack_38;
  
  (this->super_Radio_Communications_Header).super_Header.super_Header6.m_ui16PDULength = 0x20;
  this_00 = &this->m_vData;
  pcVar3 = (this->m_vData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_vData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_finish != pcVar3) {
    (this->m_vData).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = pcVar3;
  }
  uVar6 = (ulong)(Length >> 3);
  uStack_38 = in_RAX;
  std::vector<char,_std::allocator<char>_>::reserve(this_00,uVar6);
  if (7 < Length) {
    do {
      __position._M_current =
           (this->m_vData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->m_vData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<char,std::allocator<char>>::_M_realloc_insert<char_const&>
                  ((vector<char,std::allocator<char>> *)this_00,__position,D);
      }
      else {
        *__position._M_current = *D;
        ppcVar1 = &(this->m_vData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppcVar1 = *ppcVar1 + 1;
      }
      D = D + 1;
      uVar5 = (short)uVar6 - 1;
      uVar6 = (ulong)uVar5;
    } while (uVar5 != 0);
  }
  uVar6 = (long)(this->m_vData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->m_vData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start;
  this->m_ui16DataLength = (short)uVar6 * 8;
  if ((uVar6 & 3) != 0) {
    uVar7 = 1;
    do {
      uStack_38 = uStack_38 & 0xffffffffffffff;
      std::vector<char,_std::allocator<char>_>::emplace_back<char>
                (this_00,(char *)((long)&uStack_38 + 7));
      if ((uVar6 & 3) == 0) break;
      bVar4 = uVar7 < 4 - ((uint)uVar6 & 3);
      uVar7 = uVar7 + 1;
    } while (bVar4);
  }
  pKVar2 = &(this->super_Radio_Communications_Header).super_Header.super_Header6.m_ui16PDULength;
  *pKVar2 = *pKVar2 + ((short)*(undefined4 *)
                               &(this->m_vData).super__Vector_base<char,_std::allocator<char>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                      (short)*(undefined4 *)
                              &(this->m_vData).super__Vector_base<char,_std::allocator<char>_>.
                               _M_impl.super__Vector_impl_data._M_start);
  return;
}

Assistant:

void Signal_PDU::SetData( const KOCTET * D, KUINT16 Length )
{
    // If we already have data clear it first.
    m_ui16PDULength = SIGNAL_PDU_SIZE;
    m_vData.clear();

    // Copy data into the vector
    KUINT16 uiDataSz = Length / 8;
    m_vData.reserve( uiDataSz );
    for( KUINT16 i = 0; i < uiDataSz; ++i, ++D )
    {
        m_vData.push_back( *D );
    }

    // Data length does not include the padding
    m_ui16DataLength = m_vData.size() * 8;

    // Do we need to apply padding, the PDU size should be a multiple
    // of 32 bits / 4 octets.
    KUINT8 ui8PaddingNeeded = m_vData.size() % 4 == 0 ? 0 : (4 - m_vData.size() % 4); // Add padding;
    for( KUINT8 i = 0; i < ui8PaddingNeeded; ++ i )
    {
        m_vData.push_back( 0 );
    }

    // Update lengths
    m_ui16PDULength += m_vData.size();
}